

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall
CTcTokenizer::stringize_macro_actual
          (CTcTokenizer *this,CTcTokString *expbuf,char *actual_val,size_t actual_len,
          char quote_char,int add_open_quote,int add_close_quote)

{
  wchar_t c;
  int iVar1;
  wchar_t c_00;
  char *p;
  wchar_t wVar2;
  char *pcVar3;
  char quote_char_local;
  uint local_38;
  wchar_t local_34;
  
  quote_char_local = quote_char;
  if (add_open_quote != 0) {
    (*expbuf->_vptr_CTcTokString[4])(expbuf,&quote_char_local,1);
  }
  pcVar3 = actual_val + actual_len;
  local_38 = 0;
  local_34 = L'\0';
  p = actual_val;
  c = L'\0';
  do {
    while( true ) {
      wVar2 = c;
      if (pcVar3 <= p) {
        if (actual_val <= p && (long)p - (long)actual_val != 0) {
          (*expbuf->_vptr_CTcTokString[4])(expbuf,actual_val,(long)p - (long)actual_val);
        }
        if (add_close_quote != 0) {
          (*expbuf->_vptr_CTcTokString[4])(expbuf,&quote_char_local,1);
        }
        return;
      }
      c = utf8_ptr::s_getch(p);
      iVar1 = is_space(c);
      if ((wVar2 != L'\\') && (iVar1 != 0)) break;
      if ((c == quote_char_local) || ((c == L'\\' && (local_38 != 0)))) {
        if (actual_val < p) {
          (*expbuf->_vptr_CTcTokString[4])(expbuf,actual_val);
        }
        (*expbuf->_vptr_CTcTokString[4])(expbuf,"\\",1);
        actual_val = p;
      }
      if (wVar2 != L'\\') {
        if (local_38 == 0) {
          if ((c == L'\'') || (local_38 = 0, c == L'\"')) {
            local_38 = 1;
            local_34 = c;
          }
        }
        else {
          local_38 = (uint)(local_38 == 0 || c != local_34);
        }
      }
      p = utf8_ptr::s_inc(p);
    }
    if (actual_val < p) {
      (*expbuf->_vptr_CTcTokString[4])(expbuf,actual_val);
    }
    while (actual_val = p, p = actual_val, actual_val < pcVar3) {
      c_00 = utf8_ptr::s_getch(actual_val);
      iVar1 = is_space(c_00);
      if (iVar1 == 0) {
        if (wVar2 != L'\0') {
          (*expbuf->_vptr_CTcTokString[4])(expbuf," ",1);
        }
        break;
      }
      p = utf8_ptr::s_inc(actual_val);
    }
  } while( true );
}

Assistant:

void CTcTokenizer::stringize_macro_actual(CTcTokString *expbuf,
                                          const char *actual_val,
                                          size_t actual_len, char quote_char,
                                          int add_open_quote,
                                          int add_close_quote)
{
    utf8_ptr src;
    const char *start;
    int in_inner_quote;
    wchar_t inner_quote_char;
    wchar_t prvch;
    
    /* add the open quote if desired */
    if (add_open_quote)
        expbuf->append(&quote_char, 1);

    /* remember the start of the current segment */
    start = actual_val;
    
    /* 
     *   add the characters of the actual parameter value, quoting any
     *   quotes or backslashes 
     */
    for (src.set((char *)actual_val),
         in_inner_quote = FALSE, inner_quote_char = '\0', prvch = '\0' ;
         src.getptr() < actual_val + actual_len ; )
    {
        wchar_t cur;

        /* get this character */
        cur = src.getch();

        /* compress runs of whitespace to single spaces */
        if (is_space(cur) && prvch != '\\')
        {
            /* append up to this character */
            if (src.getptr() > start)
                expbuf->append(start, src.getptr() - start);

            /* find the next non-space character */
            for ( ; src.getptr() < actual_val + actual_len ; src.inc())
            {
                if (!is_space(src.getch()))
                    break;
            }

            /* 
             *   if we're not at the start or end of the string, add a
             *   single space to replace the entire run of whitespace --
             *   don't do this at the start or end of the string, since
             *   we must remove leading and trailing whitespace
             */
            if (prvch != '\0' && src.getptr() < actual_val + actual_len)
                expbuf->append(" ", 1);

            /* note that the previous character is a space */
            prvch = cur;

            /* this is the new starting point */
            start = src.getptr();

            /* proceed - we're already at the next character */
            continue;
        }

        /* 
         *   Check to see if we need to quote this character.  Quote any
         *   quote mark matching the enclosing quotes; also quote any
         *   backslash that occurs within nested quotes within the source
         *   material, but not backslashes that occur originally outside
         *   quotes.  
         */
        if (cur == quote_char
            || (cur == '\\' && in_inner_quote))
        {
            /* append the segment up to (but not including) this character */
            if (src.getptr() > start)
                expbuf->append(start, src.getptr() - start);
            
            /* add an extra backslash */
            expbuf->append("\\", 1);

            /* remember the start of the next segment */
            start = src.getptr();
        }

        /* 
         *   if this is a quote character, and it's not itself escaped,
         *   reverse our in-quote flag 
         */
        if (prvch != '\\')
        {
            /* 
             *   If we're in an inner quote, and it's a match for the open
             *   inner quote, we're no longer in a quote.  Otherwise, if
             *   we're not in quotes and this is some kind of quote, enter
             *   the new quotes.  
             */
            if (in_inner_quote && cur == inner_quote_char)
            {
                /* we're leaving the inner quoted string */
                in_inner_quote = FALSE;
            }
            else if (!in_inner_quote && (cur == '"' || cur == '\''))
            {
                /* we're entering a new inner quoted string */
                in_inner_quote = TRUE;
                inner_quote_char = cur;
            }
        }

        /* remember this as the previous character */
        prvch = cur;

        /* move on to the next character */
        src.inc();
    }

    /* if there's anything in the final segment, append it */
    if (src.getptr() > start)
        expbuf->append(start, src.getptr() - start);

    /* add the close quote if desired */
    if (add_close_quote)
        expbuf->append(&quote_char, 1);
}